

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

SceneSignal __thiscall GroundScene::update(GroundScene *this)

{
  vector<Object_*,_std::allocator<Object_*>_> *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  int extraout_var;
  ostream *poVar4;
  pointer ppOVar5;
  int i_1;
  ulong uVar6;
  int j;
  long lVar7;
  Object *pOVar8;
  Object *pOVar9;
  Plant *(*papPVar10) [10];
  int i;
  long lVar11;
  ulong uVar12;
  int j_1;
  ulong uVar13;
  ulong uStack_200;
  string local_1d8;
  stringstream debugString;
  ostream local_1a8 [376];
  
  uVar1 = this->score;
  if (uVar1 == 0) {
    uStack_200 = 10;
  }
  else {
    this->score = 0;
    uStack_200 = 0xd;
  }
  this_00 = &this->objects;
  ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = this->sunVectorN;
  papPVar10 = this->plants;
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    for (lVar7 = 0; lVar7 != 10; lVar7 = lVar7 + 1) {
      if (((*papPVar10)[lVar7] != (Plant *)0x0) &&
         (iVar2 = (*((*papPVar10)[lVar7]->super_Charactor).super_Object._vptr_Object[3])(),
         (char)iVar2 != '\0')) {
        (*papPVar10)[lVar7] = (Plant *)0x0;
      }
    }
    papPVar10 = papPVar10 + 1;
  }
  __position._M_current = ppOVar5 + iVar3;
  while (__position._M_current !=
         (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    iVar3 = (*(*__position._M_current)->_vptr_Object[3])();
    if ((char)iVar3 == '\0') {
      __position._M_current = __position._M_current + 1;
    }
    else {
      __position = std::vector<Object_*,_std::allocator<Object_*>_>::erase
                             (this_00,__position._M_current);
    }
  }
  if (this->count == 0x50) {
    genSunRandom(this);
    __position._M_current =
         (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar3 = 0;
  }
  else {
    iVar3 = this->count + 1;
  }
  this->count = iVar3;
  ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (long)this->sunVectorN;
  while (uVar12 = uVar6, uVar12 < (ulong)((long)__position._M_current - (long)ppOVar5 >> 3)) {
    iVar3 = ppOVar5[uVar12]->type % 10;
    for (uVar13 = (ulong)(int)(uVar12 + 1); uVar6 = uVar12 + 1,
        uVar13 < (ulong)((long)__position._M_current - (long)ppOVar5 >> 3); uVar13 = uVar13 + 1) {
      pOVar9 = ppOVar5[uVar13];
      iVar2 = pOVar9->type % 10;
      if (iVar3 != iVar2) {
        if ((iVar3 == 5) && (iVar2 == 4)) {
          (*ppOVar5[uVar12]->_vptr_Object[7])();
        }
        else if ((iVar3 == 3) && (iVar2 == 4)) {
          (*ppOVar5[uVar12]->_vptr_Object[0x11])();
          ppOVar5 = (this_00->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pOVar9 = ppOVar5[uVar13];
          pOVar8 = ppOVar5[uVar12];
LAB_0010cbba:
          (*pOVar9->_vptr_Object[0xe])(pOVar9,pOVar8);
        }
        else if (iVar3 == 4) {
          if (iVar2 == 5) {
            (*pOVar9->_vptr_Object[7])(pOVar9,ppOVar5[uVar12]);
          }
          else if (iVar2 == 3) {
            (*pOVar9->_vptr_Object[0x11])(pOVar9,ppOVar5[uVar12]);
            ppOVar5 = (this_00->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pOVar9 = ppOVar5[uVar12];
            pOVar8 = ppOVar5[uVar13];
            goto LAB_0010cbba;
          }
        }
      }
      ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      __position._M_current =
           (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
  }
  for (uVar6 = 0; uVar6 < (ulong)((long)__position._M_current - (long)ppOVar5 >> 3);
      uVar6 = uVar6 + 1) {
    (**ppOVar5[uVar6]->_vptr_Object)();
    _debugString = (*(this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar6]->_vptr_Object[2])();
    register0x00000004 = extraout_var;
    processObjSignal(this,(ObjectSignal *)&debugString);
    uVar12 = 0xe;
    if (this->state == 5) goto LAB_0010ccf1;
    ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  randomGenZombie(this);
  std::__cxx11::stringstream::stringstream((stringstream *)&debugString);
  poVar4 = std::operator<<(local_1a8,"n: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  drawText(0,0x2f,&local_1d8,0,0xf);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&debugString);
  uVar12 = uStack_200;
LAB_0010ccf1:
  return (SceneSignal)((ulong)uVar1 << 0x20 | uVar12);
}

Assistant:

SceneSignal GroundScene::update(){
	SceneSignal signal(GS_SIGNAL_NULL, 0);
	if(score != 0){
		signal.type = GS_SIGNAL_ADD_SCORE;
		signal.data = score;
		score = 0;
	}
	std::vector<Object*>::iterator ite = objects.begin()+sunVectorN;
	for(int i = 0; i < GSBH; ++i){
		for(int j = 0; j < GSBW; ++j){
			if(plants[i][j] != NULL && plants[i][j]->getIsDead()){
				plants[i][j] = NULL;
			}
		}
	}
	while(ite != objects.end()){
		if((*ite)->getIsDead()){
			ite = objects.erase(ite);
		}
		else{
			ite++;
		}
	}
	if(count == SUNFLOWER_GEN_SUN_SPEED){
		genSunRandom();
		count = 0;
	}
	else{
		count++;
	}
	for(int i = sunVectorN; i < objects.size(); ++i){
		int type0 = objects[i]->type%10;
		for(int j = i+1; j < objects.size(); ++j){
			int type1 = objects[j]->type%10;
			if(type0 == type1){
				continue;
			}
			else{
				if(type0 == OBJ_TYPE_BULLET && type1 == OBJ_TYPE_ZOMBIE){
					/* drawText(0, SH+2, "here1", BLACK, WHITE); */
					((Bullet*)objects[i])->interactive((Zombie*)objects[j]);
				}
				else if(type0 == OBJ_TYPE_PLANT && type1 == OBJ_TYPE_ZOMBIE){
					((Plant*)objects[i])->interactive((Zombie*)objects[j]);
					((Zombie*)objects[j])->interactive((Plant*)objects[i]);
				}
				else if(type0 == OBJ_TYPE_ZOMBIE){
					if(type1 == OBJ_TYPE_PLANT){
						((Plant*)objects[j])->interactive((Zombie*)objects[i]);
						((Zombie*)objects[i])->interactive((Plant*)objects[j]);
					}
					else if(type1 == OBJ_TYPE_BULLET){
						/* drawText(0, SH+2, "here2", BLACK, WHITE); */
						((Bullet*)objects[j])->interactive((Zombie*)objects[i]);
					}
				}
			}
		}
	}
	for(int i = 0; i < objects.size(); ++i){
		objects[i]->update();
		ObjectSignal os = objects[i]->getSignal();
		processObjSignal(os);
		if(state == STATE_OVER){
			signal.type = GS_SIGNAL_OVER; 
			return signal;
		}
	}
	randomGenZombie();


	std::stringstream debugString;
	debugString << "n: " << objects.size();
	drawText(0, SH+1, debugString.str(), BLACK, WHITE);
	return signal;
}